

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O3

void __thiscall Pl_DCT::compress(Pl_DCT *this,void *cinfo_p,Buffer *b)

{
  uint uVar1;
  Pipeline *pPVar2;
  Members *pMVar3;
  CompressConfig *pCVar4;
  JDIMENSION JVar5;
  J_COLOR_SPACE JVar6;
  void *__s;
  undefined8 *puVar7;
  size_t sVar8;
  uchar *puVar9;
  runtime_error *this_00;
  long *plVar10;
  size_type *psVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  unsigned_long __val;
  int iVar15;
  JSAMPROW row_pointer [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  jpeg_CreateCompress(cinfo_p,0x50,0x248);
  __s = operator_new__(0x10000);
  memset(__s,0,0x10000);
  pPVar2 = (this->super_Pipeline).next_;
  puVar7 = (undefined8 *)(*(code *)**(undefined8 **)((long)cinfo_p + 8))(cinfo_p,0,0x40);
  *(undefined8 **)((long)cinfo_p + 0x28) = puVar7;
  puVar7[2] = init_pipeline_destination;
  puVar7[3] = empty_pipeline_output_buffer;
  puVar7[4] = term_pipeline_destination;
  puVar7[5] = __s;
  *puVar7 = __s;
  puVar7[6] = 0x10000;
  puVar7[1] = 0x10000;
  puVar7[7] = pPVar2;
  pMVar3 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
           super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
           super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl;
  JVar5 = pMVar3->image_height;
  iVar12 = pMVar3->components;
  JVar6 = pMVar3->color_space;
  *(JDIMENSION *)((long)cinfo_p + 0x30) = pMVar3->image_width;
  *(JDIMENSION *)((long)cinfo_p + 0x34) = JVar5;
  *(int *)((long)cinfo_p + 0x38) = iVar12;
  *(J_COLOR_SPACE *)((long)cinfo_p + 0x3c) = JVar6;
  jpeg_set_defaults(cinfo_p);
  pCVar4 = ((this->m)._M_t.
            super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
            super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
            super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl)->config_callback;
  if (pCVar4 != (CompressConfig *)0x0) {
    (*pCVar4->_vptr_CompressConfig[2])(pCVar4,cinfo_p);
  }
  jpeg_start_compress(cinfo_p,1);
  uVar1 = *(uint *)((long)cinfo_p + 0x30);
  iVar12 = *(int *)((long)cinfo_p + 0x38);
  if (iVar12 < 0) {
    QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(iVar12);
    iVar12 = *(int *)((long)cinfo_p + 0x38);
    uVar14 = *(uint *)((long)cinfo_p + 0x30);
    uVar13 = *(uint *)((long)cinfo_p + 0x34);
    iVar15 = iVar12;
    if (iVar12 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar12);
      iVar15 = *(int *)((long)cinfo_p + 0x38);
    }
  }
  else {
    uVar13 = *(uint *)((long)cinfo_p + 0x34);
    uVar14 = uVar1;
    iVar15 = iVar12;
  }
  sVar8 = Buffer::getSize(b);
  __val = (long)iVar15 * (ulong)uVar14 * (ulong)uVar13;
  if (sVar8 != __val) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    sVar8 = Buffer::getSize(b);
    std::__cxx11::to_string(&local_b0,sVar8);
    std::operator+(&local_50,"Pl_DCT: image buffer size = ",&local_b0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_d0._M_dataplus._M_p = (pointer)*plVar10;
    psVar11 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar11) {
      local_d0.field_2._M_allocated_capacity = *psVar11;
      local_d0.field_2._8_8_ = plVar10[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar11;
    }
    local_d0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::to_string(&local_70,__val);
    std::operator+(&local_90,&local_d0,&local_70);
    std::runtime_error::runtime_error(this_00,(string *)&local_90);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar9 = Buffer::getBuffer(b);
  while (*(uint *)((long)cinfo_p + 0x154) < *(uint *)((long)cinfo_p + 0x34)) {
    local_90._M_dataplus._M_p =
         (pointer)(puVar9 + *(uint *)((long)cinfo_p + 0x154) * iVar12 * uVar1);
    jpeg_write_scanlines(cinfo_p,&local_90,1);
  }
  jpeg_finish_compress(cinfo_p);
  (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
  operator_delete__(__s);
  return;
}

Assistant:

void
Pl_DCT::compress(void* cinfo_p, Buffer* b)
{
    auto* cinfo = reinterpret_cast<jpeg_compress_struct*>(cinfo_p);

#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wold-style-cast"
#endif
    jpeg_create_compress(cinfo);
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic pop
#endif
    static int const BUF_SIZE = 65536;
    auto outbuffer_ph = std::make_unique<unsigned char[]>(BUF_SIZE);
    unsigned char* outbuffer = outbuffer_ph.get();
    jpeg_pipeline_dest(cinfo, outbuffer, BUF_SIZE, next());

    cinfo->image_width = m->image_width;
    cinfo->image_height = m->image_height;
    cinfo->input_components = m->components;
    cinfo->in_color_space = m->color_space;
    jpeg_set_defaults(cinfo);
    if (m->config_callback) {
        m->config_callback->apply(cinfo);
    }

    jpeg_start_compress(cinfo, TRUE);

    unsigned int width = cinfo->image_width * QIntC::to_uint(cinfo->input_components);
    size_t expected_size = QIntC::to_size(cinfo->image_height) *
        QIntC::to_size(cinfo->image_width) * QIntC::to_size(cinfo->input_components);
    if (b->getSize() != expected_size) {
        throw std::runtime_error(
            "Pl_DCT: image buffer size = " + std::to_string(b->getSize()) +
            "; expected size = " + std::to_string(expected_size));
    }
    JSAMPROW row_pointer[1];
    unsigned char* buffer = b->getBuffer();
    while (cinfo->next_scanline < cinfo->image_height) {
        // We already verified that the buffer is big enough.
        row_pointer[0] = &buffer[cinfo->next_scanline * width];
        (void)jpeg_write_scanlines(cinfo, row_pointer, 1);
    }
    jpeg_finish_compress(cinfo);
    next()->finish();
}